

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

void __thiscall CGL::SceneObjects::Triangle::drawOutline(Triangle *this,Color *c,float alpha)

{
  undefined1 in_register_00001204 [60];
  undefined1 auVar1 [64];
  
  auVar1._4_60_ = in_register_00001204;
  auVar1._0_4_ = alpha;
  glColor4f(c->r,c->g,c->b,auVar1._0_8_);
  glBegin(2);
  glVertex3d((this->p1).field_0.field_0.x,(this->p1).field_0.field_0.y,(this->p1).field_0.field_0.z)
  ;
  glVertex3d((this->p2).field_0.field_0.x,(this->p2).field_0.field_0.y,(this->p2).field_0.field_0.z)
  ;
  glVertex3d((this->p3).field_0.field_0.x,(this->p3).field_0.field_0.y,(this->p3).field_0.field_0.z)
  ;
  glEnd();
  return;
}

Assistant:

void Triangle::drawOutline(const Color &c, float alpha) const {
  glColor4f(c.r, c.g, c.b, alpha);
  glBegin(GL_LINE_LOOP);
  glVertex3d(p1.x, p1.y, p1.z);
  glVertex3d(p2.x, p2.y, p2.z);
  glVertex3d(p3.x, p3.y, p3.z);
  glEnd();
}